

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O2

int nva_wr(nva_regspace *regspace,uint32_t addr,uint64_t val)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  nva_card *pnVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  nva_card **ppnVar10;
  size_t sVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  void **ppvVar15;
  void *pvVar16;
  pci_io_handle *ppVar17;
  undefined1 uVar18;
  undefined4 in_register_00000034;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar19;
  
  ppnVar10 = nva_cards;
  iVar13 = 3;
  uVar18 = (undefined1)val;
  uVar19 = (uint)val;
  switch(regspace->type) {
  case NVA_REGSPACE_BAR0:
    sVar11 = regspace->card->bar0len;
    ppvVar15 = &regspace->card->bar0;
    goto LAB_00103100;
  case NVA_REGSPACE_BAR1:
    pnVar6 = regspace->card;
    if (pnVar6->hasbar1 == 0) {
      return 3;
    }
    sVar11 = pnVar6->bar1len;
    ppvVar15 = &pnVar6->bar1;
    goto LAB_00103100;
  case NVA_REGSPACE_BAR2:
    pnVar6 = regspace->card;
    if (pnVar6->hasbar2 == 0) {
      return 3;
    }
    sVar11 = pnVar6->bar2len;
    ppvVar15 = &pnVar6->bar2;
    goto LAB_00103100;
  case NVA_REGSPACE_IOBAR:
    ppVar17 = regspace->card->iobar;
    if (ppVar17 == (pci_io_handle *)0x0) {
      return 3;
    }
    iVar13 = regspace->regsz;
    if (regspace->card->iobarlen - (long)iVar13 < (ulong)addr) {
      return 1;
    }
    if (iVar13 == 4) {
LAB_00103724:
      pci_io_write32(ppVar17);
    }
    else if (iVar13 == 2) {
LAB_00103717:
      pci_io_write16(ppVar17,CONCAT44(in_register_00000034,addr),val & 0xffff);
    }
    else {
      if (iVar13 != 1) goto LAB_00103582;
LAB_00103273:
      pci_io_write8(ppVar17,CONCAT44(in_register_00000034,addr),val & 0xff);
    }
    break;
  case NVA_REGSPACE_RAWMEM:
    ppvVar15 = &regspace->card->rawmem;
    sVar11 = 0x100000;
LAB_00103100:
    pvVar16 = *ppvVar15;
    if (pvVar16 == (void *)0x0) {
      return 4;
    }
    uVar21 = (ulong)addr;
    if (sVar11 - (long)regspace->regsz < uVar21) {
      return 1;
    }
    iVar13 = 2;
    switch(regspace->regsz) {
    case 1:
      *(undefined1 *)((long)pvVar16 + uVar21) = uVar18;
      break;
    case 2:
      *(short *)((long)pvVar16 + uVar21) = (short)val;
      break;
    default:
      goto switchD_00102e3f_default;
    case 4:
      *(uint *)((long)pvVar16 + uVar21) = uVar19;
      break;
    case 8:
      *(uint64_t *)((long)pvVar16 + uVar21) = val;
    }
    break;
  case NVA_REGSPACE_RAWIO:
    ppVar17 = regspace->card->rawio;
    if (ppVar17 == (pci_io_handle *)0x0) {
      return 3;
    }
    iVar13 = regspace->regsz;
    if (0x10000U - iVar13 < addr) {
      return 1;
    }
    if (iVar13 == 4) goto LAB_00103724;
    if (iVar13 == 2) goto LAB_00103717;
    if (iVar13 == 1) goto LAB_00103273;
    goto LAB_00103582;
  case NVA_REGSPACE_PDAC:
    if ((regspace->card->chipset).chipset != 1) {
      return 3;
    }
    if (0x10000U - regspace->regsz < addr) {
      return 1;
    }
    if (regspace->regsz < 9) {
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x609010) = addr & 0xff;
      *(uint32_t *)((long)ppnVar10[regspace->cnum]->bar0 + 0x609014) = addr >> 8;
      bVar12 = 0;
      for (lVar14 = 0; lVar14 < regspace->regsz; lVar14 = lVar14 + 1) {
        *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x609018) =
             (uint)(val >> (bVar12 & 0x3f)) & 0xff;
        bVar12 = bVar12 + 8;
      }
      return 0;
    }
    goto LAB_00103582;
  case NVA_REGSPACE_EEPROM:
    if ((regspace->card->chipset).chipset != 1) {
      return 3;
    }
    if (regspace->regsz == 1) {
      if (0x7f < addr) {
        return 1;
      }
      do {
      } while ((*(uint *)((long)nva_cards[regspace->cnum]->bar0 + 0x60a400) >> 0x1c & 1) != 0);
      *(uint *)((long)nva_cards[regspace->cnum]->bar0 + 0x60a400) =
           uVar19 & 0xff | addr << 8 | 0x1000000;
      do {
      } while ((*(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x60a400) >> 0x1c & 1) != 0);
      return 0;
    }
    goto LAB_00103582;
  case NVA_REGSPACE_VGA_CR:
    if (0xff < addr) {
      return 1;
    }
    iVar13 = 0x3d4;
    bVar8 = false;
    goto LAB_00103558;
  case NVA_REGSPACE_VGA_SR:
    if (7 < addr) {
      return 1;
    }
    iVar13 = 0x3c4;
    bVar8 = true;
LAB_00103558:
    bVar7 = false;
LAB_0010355b:
    bVar9 = false;
LAB_0010355e:
    if (regspace->regsz != 1) goto LAB_00103582;
    iVar22 = (regspace->card->chipset).card_type;
    if (iVar22 == 1) {
      if (regspace->idx != 0) {
        return 3;
      }
      iVar22 = 0x6d0000;
    }
    else if (iVar22 < 0x50) {
      iVar22 = 0x601000;
      if (bVar7) {
        iVar22 = 0xc0000;
      }
      if (bVar8) {
        iVar22 = 0xc0000;
      }
      iVar4 = regspace->idx;
      if (2 < iVar4) {
        return 3;
      }
      iVar5 = (regspace->card->chipset).chipset;
      if ((((iVar5 < 0x17) || (iVar5 == 0x20)) || (iVar5 == 0x1a)) && (iVar4 == 1)) {
        return 3;
      }
      iVar22 = iVar4 * 0x2000 + iVar22;
    }
    else {
      if (regspace->idx != 0) {
        return 3;
      }
      iVar22 = 0x601000;
    }
    pvVar16 = nva_cards[regspace->cnum]->bar0;
    if (bVar9) {
      uVar21 = (ulong)(iVar22 + 0x3c0);
      uVar1 = *(undefined1 *)((long)pvVar16 + uVar21);
      *(char *)((long)pvVar16 + uVar21) = (char)addr;
      *(undefined1 *)((long)nva_cards[regspace->cnum]->bar0 + uVar21) = uVar18;
      *(undefined1 *)((long)nva_cards[regspace->cnum]->bar0 + uVar21) = uVar1;
    }
    else {
      uVar21 = (ulong)(uint)(iVar22 + iVar13);
      uVar1 = *(undefined1 *)((long)pvVar16 + uVar21);
      *(char *)((long)pvVar16 + uVar21) = (char)addr;
      *(undefined1 *)((long)nva_cards[regspace->cnum]->bar0 + (ulong)(iVar13 + iVar22 + 1)) = uVar18
      ;
      *(undefined1 *)((long)nva_cards[regspace->cnum]->bar0 + uVar21) = uVar1;
    }
    break;
  case NVA_REGSPACE_VGA_AR:
    if (0x1f < addr) {
      return 1;
    }
    iVar13 = 0x3c0;
    bVar9 = true;
    bVar8 = false;
    bVar7 = false;
    goto LAB_0010355e;
  case NVA_REGSPACE_VGA_GR:
    if (0xf < addr) {
      return 1;
    }
    iVar13 = 0x3ce;
    bVar7 = true;
    bVar8 = false;
    goto LAB_0010355b;
  case NVA_REGSPACE_VGA_ST:
    if ((regspace->card->chipset).chipset < 0x41) {
      return 3;
    }
    if (regspace->regsz != 1) goto LAB_00103582;
    lVar14 = 0x1380;
    if (0x4f < (regspace->card->chipset).card_type) {
      lVar14 = 0x619e40;
    }
    pvVar16 = nva_cards[regspace->cnum]->bar0;
    uVar2 = *(undefined4 *)((long)pvVar16 + lVar14 + 0xc);
    uVar3 = *(undefined4 *)((long)pvVar16 + lVar14 + 8);
    *(uint32_t *)((long)pvVar16 + lVar14 + 0xc) = addr;
    *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + lVar14 + 8) = 7;
    *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + lVar14) = uVar19;
    *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + lVar14 + 8) = uVar3;
    *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + lVar14 + 0xc) = uVar2;
    break;
  case NVA_REGSPACE_DPRAM:
    if ((regspace->card->chipset).chipset == 0x34) {
      if (regspace->regsz != 4) goto LAB_00103582;
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400bb0) = addr;
      *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x400bb4) = uVar19;
    }
    else {
      if ((regspace->card->chipset).card_type - 0x20U < 0xffffffe4) {
        return 3;
      }
      if (regspace->regsz != 4) goto LAB_00103582;
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400828) = addr;
      *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x40082c) = uVar19;
    }
    break;
  case NVA_REGSPACE_PIPE:
    if ((regspace->card->chipset).card_type - 0x50U < 0xffffffc0) {
      return 3;
    }
    if (regspace->regsz != 4) goto LAB_00103582;
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400f50) = addr;
    *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x400f54) = uVar19;
    break;
  case NVA_REGSPACE_RDI:
    uVar20 = (regspace->card->chipset).chipset;
    if ((uVar20 < 0x20) && ((0x81800000U >> (uVar20 & 0x1f) & 1) != 0)) {
      if (regspace->regsz != 4) goto LAB_00103582;
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400a08) = addr;
      *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x400a0c) = uVar19;
    }
    else {
      if ((regspace->card->chipset).card_type - 0x50U < 0xffffffd0) {
        return 3;
      }
      *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400750) = addr;
      *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x400754) = uVar19;
    }
    break;
  case NVA_REGSPACE_RDIB:
    if ((regspace->card->chipset).card_type - 0x50U < 0xffffffd0) {
      return 3;
    }
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x400750) = addr;
    *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x400758) = uVar19;
    break;
  case NVA_REGSPACE_VCOMP_CODE:
    if ((regspace->card->chipset).chipset != 0xaf) {
      return 3;
    }
    if (regspace->regsz != 4) goto LAB_00103582;
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x1c17c8) = addr;
    *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x1c17cc) = uVar19;
    break;
  case NVA_REGSPACE_VCOMP_REG:
    if ((regspace->card->chipset).chipset != 0xaf) {
      return 3;
    }
    if (regspace->regsz != 8) goto LAB_00103582;
    *(uint32_t *)((long)nva_cards[regspace->cnum]->bar0 + 0x1c17d0) = addr >> 3;
    *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x1c17d4) = uVar19;
    *(int *)((long)ppnVar10[regspace->cnum]->bar0 + 0x1c17d8) = (int)(val >> 0x20);
    break;
  case NVA_REGSPACE_MACRO_CODE:
    if ((regspace->card->chipset).chipset < 0xc0) {
      return 3;
    }
    if (regspace->regsz == 4) {
      *(undefined4 *)((long)nva_cards[regspace->cnum]->bar0 + 0x40986c) = 0x10;
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409ffc) = 2;
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) = 0xc;
      do {
      } while (*(int *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) != 0);
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x40993c) = 0xf;
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) = 10;
      do {
      } while (*(int *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) != 0);
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x40991c) = 1;
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) = 1;
      pvVar16 = ppnVar10[regspace->cnum]->bar0;
      do {
      } while (*(int *)((long)pvVar16 + 0x409928) != 0);
      for (uVar20 = 0; uVar20 < addr; uVar20 = uVar20 + 4) {
        *(undefined4 *)((long)pvVar16 + 0x409928) = 6;
        pvVar16 = ppnVar10[regspace->cnum]->bar0;
        do {
        } while (*(int *)((long)pvVar16 + 0x409928) != 0);
      }
      *(uint *)((long)pvVar16 + 0x409918) = uVar19;
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) = 7;
      do {
      } while (*(int *)((long)ppnVar10[regspace->cnum]->bar0 + 0x409928) != 0);
      return 0;
    }
    goto LAB_00103582;
  case NVA_REGSPACE_XT:
    if (regspace->regsz == 4) {
      *(undefined4 *)((long)nva_cards[regspace->cnum]->bar0 + 0x1700) = 0x30;
      *(uint32_t *)((long)ppnVar10[regspace->cnum]->bar0 + 0x700004) = addr;
      *(uint *)((long)ppnVar10[regspace->cnum]->bar0 + 0x700008) = uVar19;
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x70000) = 1;
      do {
      } while (*(int *)((long)ppnVar10[regspace->cnum]->bar0 + 0x70000) != 0);
      *(undefined4 *)((long)ppnVar10[regspace->cnum]->bar0 + 0x700000) = 2;
      do {
      } while (*(int *)((long)ppnVar10[regspace->cnum]->bar0 + 0x700000) != 0);
      return 0;
    }
LAB_00103582:
    iVar13 = 2;
  default:
    goto switchD_00102e3f_default;
  }
  iVar13 = 0;
switchD_00102e3f_default:
  return iVar13;
}

Assistant:

int nva_wr(struct nva_regspace *regspace, uint32_t addr, uint64_t val) {
	void *rawbase = 0;
	size_t rawlen;
	void *raw;
	int i;
	uint32_t vgaio;
	uint32_t vgabase;
	switch (regspace->type) {
		case NVA_REGSPACE_BAR0:
			rawbase = regspace->card->bar0;
			rawlen = regspace->card->bar0len;
			goto raw;
		case NVA_REGSPACE_BAR1:
			rawbase = regspace->card->bar1;
			rawlen = regspace->card->bar1len;
			if (!regspace->card->hasbar1)
				return NVA_ERR_NOSPC;
			goto raw;
		case NVA_REGSPACE_BAR2:
			rawbase = regspace->card->bar2;
			rawlen = regspace->card->bar2len;
			if (!regspace->card->hasbar2)
				return NVA_ERR_NOSPC;
			goto raw;
		case NVA_REGSPACE_RAWMEM:
			rawbase = regspace->card->rawmem;
			rawlen = 0x100000;
		raw:
			if (!rawbase)
				return NVA_ERR_MAP;
			if (addr > rawlen - regspace->regsz)
				return NVA_ERR_RANGE;
			raw = (uint8_t *)rawbase + addr;
			switch (regspace->regsz) {
				case 1:
					*(volatile uint8_t *)raw = val;
					return 0;
				case 2:
					*(volatile uint16_t *)raw = val;
					return 0;
				case 4:
					*(volatile uint32_t *)raw = val;
					return 0;
				case 8:
					*(volatile uint64_t *)raw = val;
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_IOBAR:
			if (!regspace->card->iobar)
				return NVA_ERR_NOSPC;
			if (addr > regspace->card->iobarlen - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					pci_io_write8(regspace->card->iobar, addr, val);
					return 0;
				case 2:
					pci_io_write16(regspace->card->iobar, addr, val);
					return 0;
				case 4:
					pci_io_write32(regspace->card->iobar, addr, val);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_RAWIO:
			if (!regspace->card->rawio)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			switch (regspace->regsz) {
				case 1:
					pci_io_write8(regspace->card->rawio, addr, val);
					return 0;
				case 2:
					pci_io_write16(regspace->card->rawio, addr, val);
					return 0;
				case 4:
					pci_io_write32(regspace->card->rawio, addr, val);
					return 0;
				default:
					return NVA_ERR_REGSZ;
			}
		case NVA_REGSPACE_PDAC:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (addr > 0x10000 - regspace->regsz)
				return NVA_ERR_RANGE;
			if (regspace->regsz > 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x609010, addr & 0xff);
			nva_wr32(regspace->cnum, 0x609014, addr >> 8);
			for (i = 0; i < regspace->regsz; i++)
				nva_wr32(regspace->cnum, 0x609018, (val >> i * 8) & 0xff);
			return 0;
		case NVA_REGSPACE_EEPROM:
			if (regspace->card->chipset.chipset != 0x01)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (addr >= 0x80)
				return NVA_ERR_RANGE;
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			nva_wr32(regspace->cnum, 0x60a400, 0x1000000 | addr << 8 | (val & 0xff));
			while (nva_rd32(regspace->cnum, 0x60a400) & 0x10000000);
			return 0;
		case NVA_REGSPACE_VGA_CR:
			vgaio = 0x3d4;
			if (addr >= 0x100)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_SR:
			vgaio = 0x3c4;
			if (addr >= 8)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_GR:
			vgaio = 0x3ce;
			if (addr >= 0x10)
				return NVA_ERR_RANGE;
			goto vga;
		case NVA_REGSPACE_VGA_AR:
			vgaio = 0x3c0;
			if (addr >= 0x20)
				return NVA_ERR_RANGE;
			goto vga;
		vga:
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			if (regspace->card->chipset.card_type == 0x01) {
				vgabase = 0x6d0000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			} else if (regspace->card->chipset.card_type < 0x50) {
				if (vgaio == 0x3c4 || vgaio == 0x3ce)
					vgabase = 0x0c0000;
				else
					vgabase = 0x601000;
				if (regspace->idx > 2)
					return NVA_ERR_NOSPC;
				if ((regspace->card->chipset.chipset < 0x17 || regspace->card->chipset.chipset == 0x1a || regspace->card->chipset.chipset == 0x20) && regspace->idx == 1)
					return NVA_ERR_NOSPC;
				vgabase += regspace->idx * 0x2000;
			} else {
				vgabase = 0x601000;
				if (regspace->idx != 0)
					return NVA_ERR_NOSPC;
			}
			if (vgaio == 0x3c0) {
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + 0x3c0);
				nva_rd8(regspace->cnum, vgabase + 0x3da);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, addr);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, val);
				nva_wr8(regspace->cnum, vgabase + 0x3c0, idx);
			} else {
				uint8_t idx = nva_rd8(regspace->cnum, vgabase + vgaio);
				nva_wr8(regspace->cnum, vgabase + vgaio, addr);
				nva_wr8(regspace->cnum, vgabase + vgaio + 1, val);
				nva_wr8(regspace->cnum, vgabase + vgaio, idx);
			}
			return 0;
		case NVA_REGSPACE_VGA_ST:
			if (regspace->card->chipset.chipset < 0x41)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 1)
				return NVA_ERR_REGSZ;
			uint32_t vstbase = 0x1380;
			if (regspace->card->chipset.card_type >= 0x50)
				vstbase = 0x619e40;
			uint32_t savepos = nva_rd32(regspace->cnum, vstbase+0xc);
			uint32_t savecfg = nva_rd32(regspace->cnum, vstbase+0x8);
			nva_wr32(regspace->cnum, vstbase+0xc, addr);
			nva_wr32(regspace->cnum, vstbase+0x8, 7);
			nva_wr32(regspace->cnum, vstbase+0x0, val);
			nva_wr32(regspace->cnum, vstbase+0x8, savecfg);
			nva_wr32(regspace->cnum, vstbase+0xc, savepos);
			return 0;
		case NVA_REGSPACE_DPRAM:
			if (regspace->card->chipset.chipset == 0x34) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400bb0, addr);
				nva_wr32(regspace->cnum, 0x400bb4, val);
				return 0;
			}
			if (regspace->card->chipset.card_type < 4 || regspace->card->chipset.card_type >= 0x20)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400828, addr);
			nva_wr32(regspace->cnum, 0x40082c, val);
			return 0;
		case NVA_REGSPACE_PIPE:
			if (regspace->card->chipset.card_type < 0x10 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x400f50, addr);
			nva_wr32(regspace->cnum, 0x400f54, val);
			return 0;
		case NVA_REGSPACE_RDI:
			if (regspace->card->chipset.chipset == 0x17 || regspace->card->chipset.chipset == 0x18 || regspace->card->chipset.chipset == 0x1f) {
				if (regspace->regsz != 4)
					return NVA_ERR_REGSZ;
				nva_wr32(regspace->cnum, 0x400a08, addr);
				nva_wr32(regspace->cnum, 0x400a0c, val);
				return 0;
			}
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			nva_wr32(regspace->cnum, 0x400750, addr);
			nva_wr32(regspace->cnum, 0x400754, val);
			return 0;
		case NVA_REGSPACE_RDIB:
			if (regspace->card->chipset.card_type < 0x20 || regspace->card->chipset.card_type >= 0x50)
				return NVA_ERR_NOSPC;
			nva_wr32(regspace->cnum, 0x400750, addr);
			nva_wr32(regspace->cnum, 0x400758, val);
			return 0;
		case NVA_REGSPACE_VCOMP_CODE:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17c8, addr);
			nva_wr32(regspace->cnum, 0x1c17cc, val);
			return 0;
		case NVA_REGSPACE_VCOMP_REG:
			if (regspace->card->chipset.chipset != 0xaf)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 8)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1c17d0, addr/8);
			nva_wr32(regspace->cnum, 0x1c17d4, val);
			nva_wr32(regspace->cnum, 0x1c17d8, val >> 32);
			return 0;
		case NVA_REGSPACE_MACRO_CODE:
			if (regspace->card->chipset.chipset < 0xc0)
				return NVA_ERR_NOSPC;
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x40986c, 0x10);
			nva_wr32(regspace->cnum, 0x409ffc, 2);
			nva_wr32(regspace->cnum, 0x409928, 0xc);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40993c, 0xf);
			nva_wr32(regspace->cnum, 0x409928, 0xa);
			while (nva_rd32(regspace->cnum, 0x409928));
			nva_wr32(regspace->cnum, 0x40991c, 0x1);
			nva_wr32(regspace->cnum, 0x409928, 0x1);
			while (nva_rd32(regspace->cnum, 0x409928));
			for (i = 0; i < addr; i+=4) {
				nva_wr32(regspace->cnum, 0x409928, 0x6);
				while (nva_rd32(regspace->cnum, 0x409928));
			}
			nva_wr32(regspace->cnum, 0x409918, val);
			nva_wr32(regspace->cnum, 0x409928, 0x7);
			while (nva_rd32(regspace->cnum, 0x409928));
			return 0;
		case NVA_REGSPACE_XT:
			if (regspace->regsz != 4)
				return NVA_ERR_REGSZ;
			nva_wr32(regspace->cnum, 0x1700, 0x30);
			nva_wr32(regspace->cnum, 0x700004, addr);
			nva_wr32(regspace->cnum, 0x700008, val);
			nva_wr32(regspace->cnum, 0x70000, 1);
			while (nva_rd32(regspace->cnum, 0x70000));
			nva_wr32(regspace->cnum, 0x700000, 2);
			while (nva_rd32(regspace->cnum, 0x700000));
			return 0;
		default:
			return NVA_ERR_NOSPC;
	}
}